

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewEdgeCalculator.cpp
# Opt level: O1

void __thiscall
NewEdgeCalculator::iterateCovAp
          (NewEdgeCalculator *this,bool pe1,uint *pos2,double *probM,uint *pos1,uint *equalBase,
          bool pe2,vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                   *cov_ap2,int *tc,double *prob0,AlignmentRecord *ap2,
          vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *cov_ap1,
          AlignmentRecord *ap1,int *cc)

{
  mapValue *val1;
  mapValue *val2;
  int iVar1;
  int iVar2;
  pointer pmVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  pointer pmVar7;
  uint *puVar8;
  ulong uVar9;
  NewEdgeCalculator *pNVar10;
  NewEdgeCalculator *this_00;
  ulong uVar11;
  double dVar12;
  
  uVar11 = (ulong)*pos1;
  pmVar7 = (cov_ap1->
           super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar9 = ((long)(cov_ap1->
                 super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar7 >> 3) *
          -0x5555555555555555;
  if (uVar11 <= uVar9 && uVar9 - uVar11 != 0) {
    do {
      pNVar10 = (NewEdgeCalculator *)(ulong)*pos2;
      pmVar3 = (cov_ap2->
               super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
               )._M_impl.super__Vector_impl_data._M_start;
      this_00 = (NewEdgeCalculator *)
                (((long)(cov_ap2->
                        super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar3 >> 3) *
                -0x5555555555555555);
      if (this_00 < pNVar10 || (long)this_00 - (long)pNVar10 == 0) {
        return;
      }
      val1 = pmVar7 + uVar11;
      val2 = pmVar3 + (long)pNVar10;
      iVar1 = val1->ref;
      iVar2 = val2->ref;
      if (iVar1 == iVar2) {
        if (val1->base == val2->base) {
          *equalBase = *equalBase + 1;
        }
        calculateProbM(this_00,val1,val2,probM);
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<unsigned_int&,unsigned_int&>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->aub,pos1,
                   pos2);
        *pos1 = *pos1 + 1;
        puVar6 = pos2;
        puVar8 = (uint *)cc;
LAB_001584b4:
        *puVar6 = *puVar6 + 1;
      }
      else {
        puVar6 = (uint *)tc;
        if (iVar2 <= iVar1) {
          puVar8 = pos2;
          if (pe2) {
            uVar4 = AlignmentRecord::getStart1(ap1);
            uVar5 = AlignmentRecord::getEnd1(ap2);
            if ((uVar5 < uVar4) &&
               (uVar4 = val2->ref, uVar5 = AlignmentRecord::getStart2(ap2), uVar4 < uVar5))
            goto LAB_001584b6;
            dVar12 = (this->SIMPSON_MAP).super__Vector_base<double,_std::allocator<double>_>._M_impl
                     .super__Vector_impl_data._M_start[val2->ref];
          }
          else {
            dVar12 = (this->SIMPSON_MAP).super__Vector_base<double,_std::allocator<double>_>._M_impl
                     .super__Vector_impl_data._M_start[iVar2];
          }
          *prob0 = (double)(~-(ulong)(dVar12 != 0.0) & 0xbfe34413509f79ff |
                           (ulong)dVar12 & -(ulong)(dVar12 != 0.0)) + *prob0;
          goto LAB_001584b4;
        }
        puVar8 = pos1;
        if (!pe1) {
LAB_001583d9:
          dVar12 = (this->SIMPSON_MAP).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar1];
          uVar11 = -(ulong)(dVar12 != 0.0);
          *prob0 = (double)(~uVar11 & 0xbfe34413509f79ff | (ulong)dVar12 & uVar11) + *prob0;
          goto LAB_001584b4;
        }
        uVar4 = AlignmentRecord::getStart1(ap2);
        uVar5 = AlignmentRecord::getEnd1(ap1);
        if ((uVar4 <= uVar5) ||
           (uVar4 = val1->ref, uVar5 = AlignmentRecord::getStart2(ap1), uVar5 <= uVar4)) {
          iVar1 = val1->ref;
          goto LAB_001583d9;
        }
      }
LAB_001584b6:
      *puVar8 = *puVar8 + 1;
      uVar11 = (ulong)*pos1;
      pmVar7 = (cov_ap1->
               super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar9 = ((long)(cov_ap1->
                     super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar7 >> 3) *
              -0x5555555555555555;
    } while (uVar11 <= uVar9 && uVar9 - uVar11 != 0);
  }
  return;
}

Assistant:

void NewEdgeCalculator::iterateCovAp(bool pe1, unsigned int& pos2, double& probM, unsigned int& pos1, unsigned int& equalBase, bool pe2, const std::vector<AlignmentRecord::mapValue>& cov_ap2, int& tc, double& prob0, const AlignmentRecord& ap2, const std::vector<AlignmentRecord::mapValue>& cov_ap1, const AlignmentRecord& ap1, int& cc) const
{
    while(pos1<cov_ap1.size() && pos2<cov_ap2.size()){
        auto& v1 = cov_ap1[pos1];
        auto& v2 = cov_ap2[pos2];
        if (v1.ref == v2.ref){
            if(v1.base == v2.base){
                equalBase++;
            }
            calculateProbM(v1,v2,probM);
            aub.emplace_back(pos1,pos2);
            pos1++;
            pos2++;
            cc++;
        }
        else if (v1.ref < v2.ref){
           if (!pe1){
               calculateProb0(v1,prob0);
               tc++;
               pos1++;
           } else {
                if (ap2.getStart1() > ap1.getEnd1() && v1.ref < ap1.getStart2()) pos1++;
                else{
                    calculateProb0(v1,prob0);
                    tc++;
                    pos1++;
                }
           } /*else if (!pe1 && pe2){
                calculateProb0(v1,prob0);
                tc++;
                pos1++;
           }*//*else if (pe1 && pe2){
                if(ap1.getEnd1() < ap2.getStart1() && v1.ref < ap1.getStart2()) pos1++;
                else{
                    calculateProb0(v1,prob0);
                    tc++;
                    pos1++;
                }
           }*/
        }
        else {
               if (!pe2){
                   calculateProb0(v2,prob0);
                   tc++;
                   pos2++;
               } else {
                   if (ap1.getStart1() > ap2.getEnd1() && v2.ref < ap2.getStart2()) pos2++;
                   else{
                       calculateProb0(v2,prob0);
                       tc++;
                       pos2++;
                   }
               } /*else if (pe1 && pe2){
                    if(ap2.getEnd1() < ap1.getStart1() && v1.ref < ap2.getStart2()) pos2++;
                    else{
                        calculateProb0(v2,prob0);
                        tc++;
                        pos2++;
                    }
               }*/
        }
    }
}